

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::addInputArgumentConversions
          (TParseContext *this,TFunction *function,TIntermNode **arguments)

{
  TType *this_00;
  TIntermediate *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TQualifier *this_02;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TIntermTyped *pTVar4;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *pvVar5;
  reference ppTVar6;
  TIntermTyped *local_58;
  TIntermTyped *local_50;
  TIntermTyped *arg;
  int i;
  TIntermAggregate *aggregate;
  TIntermNode **arguments_local;
  TFunction *function_local;
  TParseContext *this_local;
  long *plVar3;
  
  iVar2 = (*(*arguments)->_vptr_TIntermNode[6])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  for (arg._4_4_ = 0; iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(),
      (int)arg._4_4_ < iVar2; arg._4_4_ = arg._4_4_ + 1) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
    if (iVar2 == 1) {
      iVar2 = (*(*arguments)->_vptr_TIntermNode[3])();
      local_50 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      if (plVar3 == (long *)0x0) {
        iVar2 = (*(*arguments)->_vptr_TIntermNode[3])();
        local_58 = (TIntermTyped *)CONCAT44(extraout_var_02,iVar2);
      }
      else {
        pvVar5 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                 (**(code **)(*plVar3 + 400))();
        ppTVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                            (pvVar5,(long)(int)arg._4_4_);
        iVar2 = (*(*ppTVar6)->_vptr_TIntermNode[3])();
        local_58 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar2);
      }
      local_50 = local_58;
    }
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
    this_00 = *(TType **)(CONCAT44(extraout_var_03,iVar2) + 8);
    iVar2 = (*(local_50->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar1 = TType::operator!=(this_00,(TType *)CONCAT44(extraout_var_04,iVar2));
    if (bVar1) {
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
      this_02 = (TQualifier *)
                (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar2) + 8) + 0x50))();
      bVar1 = TQualifier::isParamInput(this_02);
      if (bVar1) {
        iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
        bVar1 = TType::isCoopMat(*(TType **)(CONCAT44(extraout_var_06,iVar2) + 8));
        if (!bVar1) {
          this_01 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,(ulong)arg._4_4_);
          pTVar4 = TIntermediate::addConversion
                             (this_01,EOpFunctionCall,
                              *(TType **)(CONCAT44(extraout_var_07,iVar2) + 8),local_50);
          if (pTVar4 != (TIntermTyped *)0x0) {
            iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])();
            if (iVar2 == 1) {
              *arguments = &pTVar4->super_TIntermNode;
            }
            else if (plVar3 == (long *)0x0) {
              *arguments = &pTVar4->super_TIntermNode;
            }
            else {
              pvVar5 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                       (**(code **)(*plVar3 + 400))();
              ppTVar6 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::
                        operator[](pvVar5,(long)(int)arg._4_4_);
              *ppTVar6 = &pTVar4->super_TIntermNode;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::addInputArgumentConversions(const TFunction& function, TIntermNode*& arguments) const
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();

    // Process each argument's conversion
    for (int i = 0; i < function.getParamCount(); ++i) {
        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1 ? arguments->getAsTyped() : (aggregate ? aggregate->getSequence()[i]->getAsTyped() : arguments->getAsTyped());
        if (*function[i].type != arg->getType()) {
            if (function[i].type->getQualifier().isParamInput() &&
               !function[i].type->isCoopMat()) {
                // In-qualified arguments just need an extra node added above the argument to
                // convert to the correct type.
                arg = intermediate.addConversion(EOpFunctionCall, *function[i].type, arg);
                if (arg) {
                    if (function.getParamCount() == 1)
                        arguments = arg;
                    else {
                        if (aggregate)
                            aggregate->getSequence()[i] = arg;
                        else
                            arguments = arg;
                    }
                }
            }
        }
    }
}